

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O2

int __thiscall BmsNoteManager::GetKeys(BmsNoteManager *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined8 in_RCX;
  int i;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int keycnt [20];
  
  keycnt[0x10] = 0;
  keycnt[0x11] = 0;
  keycnt[0x12] = 0;
  keycnt[0x13] = 0;
  keycnt[0xc] = 0;
  keycnt[0xd] = 0;
  keycnt[0xe] = 0;
  keycnt[0xf] = 0;
  keycnt[8] = 0;
  keycnt[9] = 0;
  keycnt[10] = 0;
  keycnt[0xb] = 0;
  keycnt[4] = 0;
  keycnt[5] = 0;
  keycnt[6] = 0;
  keycnt[7] = 0;
  keycnt[0] = 0;
  keycnt[1] = 0;
  keycnt[2] = 0;
  keycnt[3] = 0;
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
    in_RCX = 0;
    iVar1 = BmsNoteLane::GetNoteCount(this->lanes_,true,true,false);
    keycnt[lVar4] = iVar1;
    this = (BmsNoteManager *)((long)this + 0x30);
  }
  if (keycnt[0x12] == 0) {
    if (keycnt[0x11] == 0 && keycnt[0x10] == 0) {
      auVar5._0_4_ = -(uint)(keycnt[0xc] == 0);
      auVar5._4_4_ = -(uint)(keycnt[0xd] == 0);
      auVar5._8_4_ = -(uint)(keycnt[0xe] == 0);
      auVar5._12_4_ = -(uint)(keycnt[0xf] == 0);
      iVar2 = movmskps(0,auVar5);
      iVar1 = 10;
      if ((iVar2 == 0xf) && (keycnt[0xb] == 0)) {
        if (keycnt[8] == 0) {
          if (keycnt[7] == 0 && keycnt[6] == 0) {
            auVar6._0_4_ = -(uint)(keycnt[2] == 0);
            auVar6._4_4_ = -(uint)(keycnt[3] == 0);
            auVar6._8_4_ = -(uint)(keycnt[4] == 0);
            auVar6._12_4_ = -(uint)(keycnt[5] == 0);
            iVar1 = movmskps((int)in_RCX,auVar6);
            bVar3 = iVar1 != 0xf || keycnt[1] != 0;
            iVar1 = (uint)bVar3 + (uint)bVar3 * 4;
          }
          else {
            iVar1 = 7;
          }
        }
        else {
          iVar1 = 9;
        }
      }
    }
    else {
      iVar1 = 0xe;
    }
  }
  else {
    iVar1 = 0x12;
  }
  return iVar1;
}

Assistant:

int BmsNoteManager::GetKeys() {
	int keycnt[_MAX_NOTE_LANE] = { 0, };
	for (int i = 0; i < _MAX_NOTE_LANE; i++)
		keycnt[i] = lanes_[i].GetNoteCount();
	
	// check DP first
	if (keycnt[18])
		return 18;
	else if (keycnt[16] || keycnt[17])
		return 14;
	else if (keycnt[15] || keycnt[14] || keycnt[13] || keycnt[12] || keycnt[11])
		return 10;
	else if (keycnt[8])
		return 9;
	else if (keycnt[6] || keycnt[7])
		return 7;
	else if (keycnt[5] || keycnt[4] || keycnt[3] || keycnt[2] || keycnt[1])
		return 5;

	// unknown ..?
	return 0;
}